

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCache.c
# Opt level: O1

DdNode * cuddCacheLookup2(DdManager *table,DD_CTFP op,DdNode *f,DdNode *g)

{
  DdCache *pDVar1;
  DdNode *pDVar2;
  uint uVar3;
  double dVar4;
  
  uVar3 = (((uint)g & 1) + *(int *)(((ulong)g & 0xfffffffffffffffe) + 0x20) * 2 +
          (((uint)f & 1) + *(int *)(((ulong)f & 0xfffffffffffffffe) + 0x20) * 2 + (int)op) *
          0xc00005) * 0x40f1f9 >> ((byte)table->cacheShift & 0x1f);
  pDVar2 = table->cache[(int)uVar3].data;
  if ((((pDVar2 == (DdNode *)0x0) || (pDVar1 = table->cache + (int)uVar3, pDVar1->f != f)) ||
      (pDVar1->g != g)) || ((DD_CTFP)pDVar1->h != op)) {
    dVar4 = table->cacheMisses + 1.0;
    table->cacheMisses = dVar4;
    if ((-1 < table->cacheSlack) && (dVar4 * table->minHit < table->cacheHits)) {
      cuddCacheResize(table);
    }
    pDVar2 = (DdNode *)0x0;
  }
  else {
    pDVar2 = (DdNode *)((ulong)pDVar2 & 0xfffffffffffffffe);
    table->cacheHits = table->cacheHits + 1.0;
    if (pDVar2->ref == 0) {
      cuddReclaim(table,pDVar2);
    }
    pDVar2 = pDVar1->data;
  }
  return pDVar2;
}

Assistant:

DdNode *
cuddCacheLookup2(
  DdManager * table,
  DD_CTFP op,
  DdNode * f,
  DdNode * g)
{
    int posn;
    DdCache *en,*cache;
    DdNode *data;

    cache = table->cache;
#ifdef DD_DEBUG
    if (cache == NULL) {
        return(NULL);
    }
#endif

    posn = ddCHash2(op,cuddF2L(f),cuddF2L(g),table->cacheShift);
    en = &cache[posn];
    if (en->data != NULL && en->f==f && en->g==g && en->h==(ptruint)op) {
        data = Cudd_Regular(en->data);
        table->cacheHits++;
        if (data->ref == 0) {
            cuddReclaim(table,data);
        }
        return(en->data);
    }

    /* Cache miss: decide whether to resize. */
    table->cacheMisses++;

    if (table->cacheSlack >= 0 &&
        table->cacheHits > table->cacheMisses * table->minHit) {
        cuddCacheResize(table);
    }

    return(NULL);

}